

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

int Rsb_ManPerformResub6
              (Rsb_Man_t *p,int nVarsAll,word uTruth,Vec_Wrd_t *vDivTruths,word *puTruth0,
              word *puTruth1,int fVerbose)

{
  int iVar1;
  uint Truth4;
  word *pwVar2;
  word wVar3;
  int nGs;
  int nVars;
  int i;
  uint uTruthRes;
  word *pGs [200];
  word *puTruth1_local;
  word *puTruth0_local;
  Vec_Wrd_t *vDivTruths_local;
  word uTruth_local;
  Rsb_Man_t *pRStack_18;
  int nVarsAll_local;
  Rsb_Man_t *p_local;
  
  vDivTruths_local = (Vec_Wrd_t *)uTruth;
  uTruth_local._4_4_ = nVarsAll;
  pRStack_18 = p;
  iVar1 = Vec_WrdSize(vDivTruths);
  if (199 < iVar1) {
    __assert_fail("nGs < 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbDec6.c"
                  ,699,
                  "int Rsb_ManPerformResub6(Rsb_Man_t *, int, word, Vec_Wrd_t *, word *, word *, int)"
                 );
  }
  for (nGs = 0; nGs < iVar1; nGs = nGs + 1) {
    pwVar2 = Vec_WrdEntryP(vDivTruths,nGs);
    *(word **)(&i + (long)nGs * 2) = pwVar2;
  }
  Truth4 = Rsb_DecPerformInt(pRStack_18,uTruth_local._4_4_,(word *)&vDivTruths_local,(word **)&i,
                             iVar1,iVar1,0);
  if (Truth4 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    if (fVerbose != 0) {
      Rsb_DecPrintFunc(pRStack_18,Truth4,(word *)&vDivTruths_local,(word **)&i,iVar1,
                       uTruth_local._4_4_);
      pwVar2 = Vec_WrdArray(pRStack_18->vCexes);
      Rsb_DecPrintTable(pwVar2,iVar1,iVar1,pRStack_18->vTries);
    }
    iVar1 = Vec_IntSize(pRStack_18->vFanins);
    wVar3 = Abc_Tt6Stretch((ulong)Truth4,iVar1);
    *puTruth0 = wVar3;
    wVar3 = Abc_Tt6Stretch((ulong)(Truth4 >> ((byte)(1 << ((byte)iVar1 & 0x1f)) & 0x1f)),iVar1);
    *puTruth1 = wVar3;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Rsb_ManPerformResub6( Rsb_Man_t * p, int nVarsAll, word uTruth, Vec_Wrd_t * vDivTruths, word * puTruth0, word * puTruth1, int fVerbose )
{
    word * pGs[200];
    unsigned uTruthRes;
    int i, nVars, nGs = Vec_WrdSize(vDivTruths);
    assert( nGs < 200 );
    for ( i = 0; i < nGs; i++ )
        pGs[i] = Vec_WrdEntryP(vDivTruths,i);
    uTruthRes = Rsb_DecPerformInt( p, nVarsAll, &uTruth, pGs, nGs, nGs, 0 );
    if ( uTruthRes == 0 )
        return 0;

    if ( fVerbose )
        Rsb_DecPrintFunc( p, uTruthRes, &uTruth, pGs, nGs, nVarsAll );
    if ( fVerbose )
        Rsb_DecPrintTable( Vec_WrdArray(p->vCexes), nGs, nGs, p->vTries );

    nVars = Vec_IntSize(p->vFanins);
    *puTruth0 = Abc_Tt6Stretch( uTruthRes,                 nVars );
    *puTruth1 = Abc_Tt6Stretch( uTruthRes >> (1 << nVars), nVars );
    return 1;
}